

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idmap.cpp
# Opt level: O1

shared_ptr<mbc::Val::ValBase> __thiscall Idmap::get(Idmap *this,string *name)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  const_iterator cVar2;
  mapped_type *pmVar3;
  undefined8 *puVar4;
  key_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<mbc::Val::ValBase> sVar5;
  
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mbc::Val::ValBase>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mbc::Val::ValBase>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mbc::Val::ValBase>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mbc::Val::ValBase>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mbc::Val::ValBase>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mbc::Val::ValBase>_>_>_>
                  *)name,in_RDX);
  if (cVar2._M_node != (_Base_ptr)&name->_M_string_length) {
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mbc::Val::ValBase>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mbc::Val::ValBase>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mbc::Val::ValBase>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mbc::Val::ValBase>_>_>_>
                           *)name,in_RDX);
    *(element_type **)&(this->idmap_)._M_t._M_impl =
         (pmVar3->super___shared_ptr<mbc::Val::ValBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var1 = (pmVar3->super___shared_ptr<mbc::Val::ValBase,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
             ._M_pi;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
     &(this->idmap_)._M_t._M_impl.super__Rb_tree_header._M_header = p_Var1;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      }
    }
    sVar5.super___shared_ptr<mbc::Val::ValBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar5.super___shared_ptr<mbc::Val::ValBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<mbc::Val::ValBase>)
           sVar5.super___shared_ptr<mbc::Val::ValBase,_(__gnu_cxx::_Lock_policy)2>;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = "Error! the idmap do not have the variable";
  __cxa_throw(puVar4,&char_const*::typeinfo,0);
}

Assistant:

shared_ptr<mbc::Val::ValBase> Idmap::get (string name) {
    if (idmap_.count(name)) {
        return idmap_[name];
    } else {
        throw "Error! the idmap do not have the variable";
    }
}